

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::Operation::~Operation(Operation *this)

{
  Operation *this_local;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Operation_0066fec8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr(&this->m_sync);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::~vector(&this->m_syncDeps);
  tcu::ThreadUtil::Operation::~Operation(&this->super_Operation);
  return;
}

Assistant:

Operation::~Operation (void)
{
}